

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  long lVar1;
  stbi_uc *psVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  stbi_uc sVar7;
  byte bVar8;
  byte bVar9;
  stbi_uc sVar10;
  stbi_uc sVar11;
  stbi_uc sVar12;
  stbi_uc sVar13;
  stbi_uc sVar14;
  stbi_uc sVar15;
  stbi_uc sVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  stbi_uc *psVar20;
  char *pcVar21;
  byte bVar22;
  int iVar23;
  undefined4 in_register_0000000c;
  ulong uVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  uint n;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  size_t __n;
  stbi_uc (*pal) [4];
  long *in_FS_OFFSET;
  
  psVar2 = g->out;
  if (psVar2 == (stbi_uc *)0x0) {
    sVar7 = stbi__get8(s);
    if (((((sVar7 != 'G') || (sVar7 = stbi__get8(s), sVar7 != 'I')) ||
         (sVar7 = stbi__get8(s), sVar7 != 'F')) || (sVar7 = stbi__get8(s), sVar7 != '8')) ||
       (((sVar7 = stbi__get8(s), sVar7 != '7' && (sVar7 != '9')) ||
        (sVar7 = stbi__get8(s), sVar7 != 'a')))) {
      pcVar21 = "not GIF";
      goto LAB_00164499;
    }
    in_FS_OFFSET[-0x81] = (long)"";
    sVar7 = stbi__get8(s);
    sVar10 = stbi__get8(s);
    g->w = (uint)CONCAT11(sVar10,sVar7);
    sVar7 = stbi__get8(s);
    sVar10 = stbi__get8(s);
    g->h = (uint)CONCAT11(sVar10,sVar7);
    bVar8 = stbi__get8(s);
    g->flags = (uint)bVar8;
    bVar8 = stbi__get8(s);
    g->bgindex = (uint)bVar8;
    bVar8 = stbi__get8(s);
    g->ratio = (uint)bVar8;
    g->transparent = -1;
    if ((g->w < 0x1000001) && (g->h < 0x1000001)) {
      if (comp != (int *)0x0) {
        *comp = 4;
      }
      bVar8 = (byte)g->flags;
      if ((char)bVar8 < '\0') {
        stbi__gif_parse_colortable(s,g->pal,2 << (bVar8 & 7),-1);
      }
      iVar25 = g->w;
      iVar18 = g->h;
      iVar23 = stbi__mad3sizes_valid(4,iVar25,iVar18,0);
      if (iVar23 != 0) {
        iVar18 = iVar18 * iVar25;
        __n = (size_t)(iVar18 * 4);
        lVar1 = *in_FS_OFFSET + -0x430;
        psVar20 = (stbi_uc *)(*(code *)in_FS_OFFSET[-0x85])(lVar1,1);
        g->out = psVar20;
        psVar20 = (stbi_uc *)(*(code *)in_FS_OFFSET[-0x85])(lVar1,1);
        g->background = psVar20;
        psVar20 = (stbi_uc *)(*(code *)in_FS_OFFSET[-0x85])(lVar1);
        g->history = psVar20;
        if ((g->out == (stbi_uc *)0x0) ||
           (psVar20 == (stbi_uc *)0x0 || g->background == (stbi_uc *)0x0)) {
          pcVar21 = "outofmem";
          goto LAB_00164499;
        }
        memset(g->out,0,__n);
        memset(g->background,0,__n);
        memset(g->history,0,(long)iVar18);
        goto LAB_001642ab;
      }
    }
    pcVar21 = "too large";
  }
  else {
    uVar30 = (uint)g->eflags >> 2 & 7;
    uVar17 = g->h * g->w;
    uVar31 = 2;
    if (uVar30 != 3) {
      uVar31 = uVar30;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar31 = uVar30;
    }
    if (uVar31 == 3) {
      if (0 < (int)uVar17) {
        uVar24 = 0;
        do {
          if (g->history[uVar24] != '\0') {
            *(undefined4 *)(g->out + uVar24 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar24 * 4);
          }
          uVar24 = uVar24 + 1;
        } while (uVar17 != uVar24);
      }
    }
    else if ((uVar31 == 2) && (0 < (int)uVar17)) {
      uVar24 = 0;
      do {
        if (g->history[uVar24] != '\0') {
          *(undefined4 *)(g->out + uVar24 * 4) = *(undefined4 *)(g->background + uVar24 * 4);
        }
        uVar24 = uVar24 + 1;
      } while (uVar17 != uVar24);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
LAB_001642ab:
    memset(g->history,0,(long)g->h * (long)g->w);
    pal = g->pal;
    while (sVar7 = stbi__get8(s), sVar7 == '!') {
      sVar7 = stbi__get8(s);
      if (sVar7 == 0xf9) {
        bVar8 = stbi__get8(s);
        if (bVar8 == 4) {
          bVar8 = stbi__get8(s);
          g->eflags = (uint)bVar8;
          bVar8 = stbi__get8(s);
          bVar9 = stbi__get8(s);
          g->delay = ((uint)bVar9 * 0x200 + (uint)bVar8 * 2) * 5;
          if (-1 < (long)g->transparent) {
            g->pal[g->transparent][3] = 0xff;
          }
          if ((g->eflags & 1) != 0) {
            bVar8 = stbi__get8(s);
            g->transparent = (uint)bVar8;
            g->pal[bVar8][3] = '\0';
            goto LAB_001643c3;
          }
          if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
            psVar20 = s->img_buffer;
LAB_001643a4:
            s->img_buffer = psVar20 + 1;
          }
          else {
            psVar20 = s->img_buffer;
            iVar25 = (int)s->img_buffer_end - (int)psVar20;
            if (0 < iVar25) goto LAB_001643a4;
            s->img_buffer = s->img_buffer_end;
            (*(s->io).skip)(s->io_user_data,1 - iVar25);
          }
          g->transparent = -1;
          goto LAB_001643c3;
        }
        stbi__skip(s,(uint)bVar8);
      }
      else {
LAB_001643c3:
        while (bVar8 = stbi__get8(s), bVar8 != 0) {
          stbi__skip(s,(uint)bVar8);
        }
      }
    }
    if (sVar7 == ';') {
      return (stbi_uc *)s;
    }
    if (sVar7 == ',') {
      sVar7 = stbi__get8(s);
      sVar10 = stbi__get8(s);
      sVar11 = stbi__get8(s);
      sVar12 = stbi__get8(s);
      sVar13 = stbi__get8(s);
      sVar14 = stbi__get8(s);
      sVar15 = stbi__get8(s);
      sVar16 = stbi__get8(s);
      iVar25 = (uint)CONCAT11(sVar14,sVar13) + (uint)CONCAT11(sVar10,sVar7);
      if (iVar25 <= g->w) {
        iVar18 = (uint)CONCAT11(sVar16,sVar15) + (uint)CONCAT11(sVar12,sVar11);
        if (iVar18 <= g->h) {
          iVar23 = g->w * 4;
          g->line_size = iVar23;
          iVar29 = (uint)CONCAT11(sVar10,sVar7) << 2;
          g->start_x = iVar29;
          iVar26 = (uint)CONCAT11(sVar12,sVar11) * iVar23;
          g->start_y = iVar26;
          g->max_x = iVar25 * 4;
          iVar18 = iVar18 * iVar23;
          g->max_y = iVar18;
          g->cur_x = iVar29;
          if (CONCAT11(sVar14,sVar13) != 0) {
            iVar18 = iVar26;
          }
          g->cur_y = iVar18;
          bVar8 = stbi__get8(s);
          g->lflags = (uint)bVar8;
          iVar25 = g->line_size * 8;
          if ((bVar8 & 0x40) == 0) {
            iVar25 = g->line_size;
          }
          g->step = iVar25;
          g->parse = (int)((uint)bVar8 << 0x19) >> 0x1f & 3;
          if ((char)bVar8 < '\0') {
            pal = g->lpal;
            iVar25 = -1;
            if ((g->eflags & 1) != 0) {
              iVar25 = g->transparent;
            }
            stbi__gif_parse_colortable(s,pal,2 << (bVar8 & 7),iVar25);
          }
          else if ((g->flags & 0x80) == 0) {
            pcVar21 = "missing color table";
            goto LAB_00164499;
          }
          g->color_table = *pal;
          bVar8 = stbi__get8(s);
          if (0xc < bVar8) {
            return (stbi_uc *)0x0;
          }
          uVar31 = 1 << (bVar8 & 0x1f);
          uVar24 = 0;
          do {
            g->codes[uVar24].prefix = -1;
            g->codes[uVar24].first = (stbi_uc)uVar24;
            g->codes[uVar24].suffix = (stbi_uc)uVar24;
            uVar24 = uVar24 + 1;
          } while (uVar31 != uVar24);
          uVar32 = (2 << (bVar8 & 0x1f)) - 1;
          n = 0;
          iVar25 = 0;
          uVar17 = 0;
          bVar4 = false;
          uVar30 = uVar31 + 2;
          uVar5 = 0xffffffff;
          iVar18 = bVar8 + 1;
          uVar6 = uVar32;
LAB_0016463e:
          do {
            for (; uVar19 = uVar6, iVar23 = iVar18, uVar27 = uVar5, uVar28 = uVar30, bVar3 = bVar4,
                iVar18 = iVar25 - iVar23, iVar25 < iVar23; iVar25 = iVar25 + 8) {
              if (n == 0) {
                bVar9 = stbi__get8(s);
                if (bVar9 == 0) goto LAB_001647bd;
                n = (uint)bVar9;
              }
              n = n - 1;
              bVar9 = stbi__get8(s);
              bVar22 = (byte)iVar25;
              uVar17 = uVar17 | (uint)bVar9 << (bVar22 & 0x1f);
              bVar4 = bVar3;
              uVar30 = uVar28;
              uVar5 = uVar27;
              iVar18 = iVar23;
              uVar6 = uVar19;
            }
            uVar30 = (int)uVar17 >> ((byte)iVar23 & 0x1f);
            uVar33 = uVar17 & uVar19;
            iVar25 = iVar18;
            uVar17 = uVar30;
            bVar4 = true;
            uVar30 = uVar31 + 2;
            uVar5 = 0xffffffff;
            iVar18 = bVar8 + 1;
            uVar6 = uVar32;
          } while (uVar33 == uVar31);
          if (uVar33 == uVar31 + 1) {
            while( true ) {
              stbi__skip(s,n);
              bVar8 = stbi__get8(s);
              if (bVar8 == 0) break;
              n = (uint)bVar8;
            }
LAB_001647bd:
            psVar20 = g->out;
            if (psVar20 == (stbi_uc *)0x0) {
              return (stbi_uc *)0x0;
            }
            if (psVar2 == (stbi_uc *)0x0) {
              uVar31 = g->h * g->w;
              if (0 < (int)uVar31 && 0 < g->bgindex) {
                uVar24 = 0;
                do {
                  if (g->history[uVar24] == '\0') {
                    g->pal[g->bgindex][3] = 0xff;
                    *(stbi_uc (*) [4])(g->out + uVar24 * 4) = g->pal[g->bgindex];
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar31 != uVar24);
                return psVar20;
              }
              return psVar20;
            }
            return psVar20;
          }
          if ((int)uVar33 <= (int)uVar28) {
            if (!bVar3) {
              pcVar21 = "no clear code";
              goto LAB_00164499;
            }
            if ((int)uVar27 < 0) {
              if (uVar33 == uVar28) goto LAB_00164793;
            }
            else {
              if (0x1fff < (int)uVar28) {
                pcVar21 = "too many codes";
                goto LAB_00164499;
              }
              g->codes[(int)uVar28].prefix = (stbi__int16)uVar27;
              sVar7 = g->codes[uVar27].first;
              g->codes[(int)uVar28].first = sVar7;
              if (uVar33 != uVar28 + 1) {
                sVar7 = g->codes[(int)uVar33].first;
              }
              g->codes[(int)uVar28].suffix = sVar7;
              uVar28 = uVar28 + 1;
            }
            stbi__out_gif_code(g,(stbi__uint16)uVar33);
            bVar4 = true;
            uVar30 = uVar28;
            uVar5 = uVar33;
            iVar18 = iVar23 + 1;
            uVar6 = ~(-1 << ((byte)(iVar23 + 1) & 0x1f));
            if (0xfff < (int)uVar28 || (uVar28 & uVar19) != 0) {
              iVar18 = iVar23;
              uVar6 = uVar19;
            }
            goto LAB_0016463e;
          }
LAB_00164793:
          pcVar21 = "illegal code in raster";
          goto LAB_00164499;
        }
      }
      pcVar21 = "bad Image Descriptor";
    }
    else {
      pcVar21 = "unknown code";
    }
  }
LAB_00164499:
  in_FS_OFFSET[-0x81] = (long)pcVar21;
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose;
   int first_frame;
   int pi;
   int pcount;
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0;
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background;
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame.
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1;
   } else {
      // second frame - how do we dispose of the previous one?
      dispose = (g->eflags & 0x1C) >> 2;
      pcount = g->w * g->h;

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 );
            }
         }
      } else if (dispose == 2) {
         // restore what was changed last frame to background before that frame;
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 );
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame;
      memcpy( g->background, g->out, 4 * g->w * g->h );
   }

   // clear my history;
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s);
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");

            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame,
            pcount = g->w * g->h;
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be;
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 );
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s);
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255;
                  }
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0;
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1);
                     g->transparent = -1;
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            }
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}